

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::unit,units::precise_unit>
                 (double val,unit *start,precise_unit *result,double baseValue)

{
  precise_unit *ppVar1;
  unit *puVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  bool local_81;
  bool local_75;
  unit local_5c;
  unit local_54;
  unit_data local_4c;
  double local_48;
  double converted_val;
  unit_data local_38;
  unit_data local_34;
  double local_30;
  double baseValue_local;
  precise_unit *result_local;
  unit *start_local;
  double val_local;
  
  local_30 = baseValue;
  baseValue_local = (double)result;
  result_local = (precise_unit *)start;
  start_local = (unit *)val;
  bVar3 = operator==(start,result);
  if (((bVar3) || (bVar3 = is_default((unit *)result_local), bVar3)) ||
     (bVar3 = is_default((precise_unit *)baseValue_local), bVar3)) {
    return (double)start_local;
  }
  local_34 = unit::base_units((unit *)result_local);
  local_38 = precise_unit::base_units((precise_unit *)baseValue_local);
  bVar3 = detail::unit_data::operator==(&local_34,&local_38);
  puVar2 = start_local;
  if (bVar3) {
    dVar6 = unit::multiplier((unit *)result_local);
    dVar7 = precise_unit::multiplier((precise_unit *)baseValue_local);
    return ((double)puVar2 * dVar6) / dVar7;
  }
  bVar3 = unit::is_per_unit((unit *)result_local);
  bVar4 = precise_unit::is_per_unit((precise_unit *)baseValue_local);
  ppVar1 = result_local;
  if (bVar3 != bVar4) {
    local_4c = precise_unit::base_units((precise_unit *)baseValue_local);
    bVar3 = unit::has_same_base((unit *)ppVar1,&local_4c);
    local_81 = true;
    if (!bVar3) {
      local_54 = unit_cast((unit *)result_local);
      bVar3 = unit::operator==((unit *)&pu,&local_54);
      local_81 = true;
      if (!bVar3) {
        local_5c = unit_cast((precise_unit *)baseValue_local);
        local_81 = unit::operator==((unit *)&pu,&local_5c);
      }
    }
    if (local_81 == false) {
      return NAN;
    }
    bVar3 = unit::is_per_unit((unit *)result_local);
    if (bVar3) {
      start_local = (unit *)((double)start_local * local_30);
    }
    puVar2 = start_local;
    dVar6 = unit::multiplier((unit *)result_local);
    dVar7 = precise_unit::multiplier((precise_unit *)baseValue_local);
    start_local = (unit *)(((double)puVar2 * dVar6) / dVar7);
    bVar3 = precise_unit::is_per_unit((precise_unit *)baseValue_local);
    if (bVar3) {
      start_local = (unit *)((double)start_local / local_30);
    }
    return (double)start_local;
  }
  bVar3 = unit::has_e_flag((unit *)result_local);
  if (!bVar3) {
    bVar3 = precise_unit::has_e_flag((precise_unit *)baseValue_local);
    local_75 = false;
    if (!bVar3) goto LAB_0013b70c;
  }
  ppVar1 = result_local;
  converted_val._4_4_ = precise_unit::base_units((precise_unit *)baseValue_local);
  local_75 = unit::has_same_base((unit *)ppVar1,(unit_data *)((long)&converted_val + 4));
LAB_0013b70c:
  if (local_75 != false) {
    local_48 = detail::convertFlaggedUnits<units::unit,units::precise_unit>
                         ((double)start_local,(unit *)result_local,(precise_unit *)baseValue_local,
                          local_30);
    uVar5 = std::isnan(local_48);
    if ((uVar5 & 1) == 0) {
      return local_48;
    }
  }
  dVar6 = convert<units::unit,units::precise_unit>
                    ((double)start_local,(unit *)result_local,(precise_unit *)baseValue_local);
  return dVar6;
}

Assistant:

double convert(double val, const UX& start, const UX2& result, double baseValue)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }

    // if the per unit is equivalent, no baseValue is needed so give to first
    // function
    if (start.is_per_unit() == result.is_per_unit()) {
        if ((start.has_e_flag() || result.has_e_flag()) &&
            start.has_same_base(result.base_units())) {
            double converted_val =
                detail::convertFlaggedUnits(val, start, result, baseValue);
            if (!std::isnan(converted_val)) {
                return converted_val;
            }
        }
        return convert(val, start, result);
    }

    if (start.has_same_base(result.base_units()) || pu == unit_cast(start) ||
        pu == unit_cast(result)) {
        if (start.is_per_unit()) {
            val = val * baseValue;
        }
        val = val * start.multiplier() / result.multiplier();
        if (result.is_per_unit()) {
            val /= baseValue;
        }
        return val;
    }
    // this would require two base values which power might be assumed but
    // assuming a base voltage is dangerous
    return constants::invalid_conversion;
}